

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::Draw::anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
createInstance(DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this,
              Context *context)

{
  DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this_00;
  Context *context_local;
  DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this_local;
  
  this_00 = (DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *)
            operator_new(0x1a8);
  DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::DrawTestInstance
            (this_00,context,&this->m_data);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* DrawTestCase<T>::createInstance (Context& context) const
{
	return new DrawTestInstance<T>(context, m_data);
}